

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O2

void __thiscall BlurayHelper::setVolumeLabel(BlurayHelper *this,string *label)

{
  IsoWriter *this_00;
  string local_30;
  
  this_00 = this->m_isoWriter;
  if (this_00 != (IsoWriter *)0x0) {
    unquoteStr(&local_30,label);
    IsoWriter::setVolumeLabel(this_00,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void BlurayHelper::setVolumeLabel(const std::string& label) const
{
    if (m_isoWriter)
        m_isoWriter->setVolumeLabel(unquoteStr(label));
}